

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_dr_flac__seek_to_pcm_frame__binary_search_internal
                    (ma_dr_flac *pFlac,ma_uint64 pcmFrameIndex,ma_uint64 byteRangeLo,
                    ma_uint64 byteRangeHi)

{
  ma_bool32 mVar1;
  long in_RCX;
  long in_RDX;
  ulong in_RSI;
  ma_dr_flac *in_RDI;
  float approxCompressionRatio;
  ma_uint64 newPCMRangeHi;
  ma_uint64 newPCMRangeLo;
  ma_uint32 seekForwardThreshold;
  ma_uint64 closestSeekOffsetBeforeTargetPCMFrame;
  ma_uint64 lastSuccessfulSeekOffset;
  ma_uint64 pcmRangeHi;
  ma_uint64 pcmRangeLo;
  ma_uint64 targetByte;
  ma_uint64 *in_stack_ffffffffffffff88;
  uint uVar2;
  float in_stack_ffffffffffffff94;
  ulong in_stack_ffffffffffffff98;
  ulong in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  uint uVar3;
  long local_50;
  ma_uint64 local_38;
  long local_28;
  
  local_38 = in_RDI->totalPCMFrameCount;
  local_50 = in_RDX;
  local_28 = in_RCX;
  if (in_RDI->maxBlockSizeInPCMFrames == 0) {
    uVar2 = 0x1000;
    uVar3 = uVar2;
  }
  else {
    uVar2 = (uint)in_RDI->maxBlockSizeInPCMFrames << 1;
    uVar3 = uVar2;
  }
  do {
    mVar1 = ma_dr_flac__seek_to_approximate_flac_frame_to_byte
                      ((ma_dr_flac *)CONCAT44(uVar3,in_stack_ffffffffffffffa8),
                       in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                       CONCAT44(in_stack_ffffffffffffff94,uVar2),in_stack_ffffffffffffff88);
    if (mVar1 == 0) {
LAB_0028f9a0:
      ma_dr_flac__seek_to_first_frame((ma_dr_flac *)CONCAT44(in_stack_ffffffffffffff94,uVar2));
      return 0;
    }
    ma_dr_flac__get_pcm_frame_range_of_current_flac_frame
              (in_RDI,(ma_uint64 *)&stack0xffffffffffffffa0,(ma_uint64 *)&stack0xffffffffffffff98);
    if (local_38 == in_stack_ffffffffffffffa0) {
      mVar1 = ma_dr_flac__seek_to_approximate_flac_frame_to_byte
                        ((ma_dr_flac *)CONCAT44(uVar3,in_stack_ffffffffffffffa8),
                         in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                         CONCAT44(in_stack_ffffffffffffff94,uVar2),in_stack_ffffffffffffff88);
      if ((mVar1 != 0) &&
         (mVar1 = ma_dr_flac__decode_flac_frame_and_seek_forward_by_pcm_frames
                            ((ma_dr_flac *)CONCAT44(in_stack_ffffffffffffff94,uVar2),
                             (ma_uint64)in_stack_ffffffffffffff88), mVar1 != 0)) {
        return 1;
      }
      goto LAB_0028f9a0;
    }
    if ((in_stack_ffffffffffffffa0 <= in_RSI) && (in_RSI <= in_stack_ffffffffffffff98)) {
      mVar1 = ma_dr_flac__decode_flac_frame_and_seek_forward_by_pcm_frames
                        ((ma_dr_flac *)CONCAT44(in_stack_ffffffffffffff94,uVar2),
                         (ma_uint64)in_stack_ffffffffffffff88);
      if (mVar1 != 0) {
        return 1;
      }
      goto LAB_0028f9a0;
    }
    in_stack_ffffffffffffff94 =
         (float)(long)(-1 - in_RDI->firstFLACFramePosInBytes) /
         ((float)(long)(in_stack_ffffffffffffffa0 * in_RDI->channels * (ulong)in_RDI->bitsPerSample)
         / 8.0);
    local_38 = in_stack_ffffffffffffffa0;
    if (in_RSI < in_stack_ffffffffffffffa0) {
      local_28 = -1;
    }
    else {
      if (in_RSI - in_stack_ffffffffffffffa0 < (ulong)uVar3) {
        mVar1 = ma_dr_flac__decode_flac_frame_and_seek_forward_by_pcm_frames
                          ((ma_dr_flac *)CONCAT44(in_stack_ffffffffffffff94,uVar2),
                           (ma_uint64)in_stack_ffffffffffffff88);
        if (mVar1 != 0) {
          return 1;
        }
        goto LAB_0028f9a0;
      }
      if (local_28 != -1) {
        local_28 = -1;
      }
      if (local_50 != -1) {
        local_50 = -1;
      }
    }
  } while( true );
}

Assistant:

static ma_bool32 ma_dr_flac__seek_to_pcm_frame__binary_search_internal(ma_dr_flac* pFlac, ma_uint64 pcmFrameIndex, ma_uint64 byteRangeLo, ma_uint64 byteRangeHi)
{
    ma_uint64 targetByte;
    ma_uint64 pcmRangeLo = pFlac->totalPCMFrameCount;
    ma_uint64 pcmRangeHi = 0;
    ma_uint64 lastSuccessfulSeekOffset = (ma_uint64)-1;
    ma_uint64 closestSeekOffsetBeforeTargetPCMFrame = byteRangeLo;
    ma_uint32 seekForwardThreshold = (pFlac->maxBlockSizeInPCMFrames != 0) ? pFlac->maxBlockSizeInPCMFrames*2 : 4096;
    targetByte = byteRangeLo + (ma_uint64)(((ma_int64)((pcmFrameIndex - pFlac->currentPCMFrame) * pFlac->channels * pFlac->bitsPerSample)/8.0f) * MA_DR_FLAC_BINARY_SEARCH_APPROX_COMPRESSION_RATIO);
    if (targetByte > byteRangeHi) {
        targetByte = byteRangeHi;
    }
    for (;;) {
        if (ma_dr_flac__seek_to_approximate_flac_frame_to_byte(pFlac, targetByte, byteRangeLo, byteRangeHi, &lastSuccessfulSeekOffset)) {
            ma_uint64 newPCMRangeLo;
            ma_uint64 newPCMRangeHi;
            ma_dr_flac__get_pcm_frame_range_of_current_flac_frame(pFlac, &newPCMRangeLo, &newPCMRangeHi);
            if (pcmRangeLo == newPCMRangeLo) {
                if (!ma_dr_flac__seek_to_approximate_flac_frame_to_byte(pFlac, closestSeekOffsetBeforeTargetPCMFrame, closestSeekOffsetBeforeTargetPCMFrame, byteRangeHi, &lastSuccessfulSeekOffset)) {
                    break;
                }
                if (ma_dr_flac__decode_flac_frame_and_seek_forward_by_pcm_frames(pFlac, pcmFrameIndex - pFlac->currentPCMFrame)) {
                    return MA_TRUE;
                } else {
                    break;
                }
            }
            pcmRangeLo = newPCMRangeLo;
            pcmRangeHi = newPCMRangeHi;
            if (pcmRangeLo <= pcmFrameIndex && pcmRangeHi >= pcmFrameIndex) {
                if (ma_dr_flac__decode_flac_frame_and_seek_forward_by_pcm_frames(pFlac, pcmFrameIndex - pFlac->currentPCMFrame) ) {
                    return MA_TRUE;
                } else {
                    break;
                }
            } else {
                const float approxCompressionRatio = (ma_int64)(lastSuccessfulSeekOffset - pFlac->firstFLACFramePosInBytes) / ((ma_int64)(pcmRangeLo * pFlac->channels * pFlac->bitsPerSample)/8.0f);
                if (pcmRangeLo > pcmFrameIndex) {
                    byteRangeHi = lastSuccessfulSeekOffset;
                    if (byteRangeLo > byteRangeHi) {
                        byteRangeLo = byteRangeHi;
                    }
                    targetByte = byteRangeLo + ((byteRangeHi - byteRangeLo) / 2);
                    if (targetByte < byteRangeLo) {
                        targetByte = byteRangeLo;
                    }
                } else  {
                    if ((pcmFrameIndex - pcmRangeLo) < seekForwardThreshold) {
                        if (ma_dr_flac__decode_flac_frame_and_seek_forward_by_pcm_frames(pFlac, pcmFrameIndex - pFlac->currentPCMFrame)) {
                            return MA_TRUE;
                        } else {
                            break;
                        }
                    } else {
                        byteRangeLo = lastSuccessfulSeekOffset;
                        if (byteRangeHi < byteRangeLo) {
                            byteRangeHi = byteRangeLo;
                        }
                        targetByte = lastSuccessfulSeekOffset + (ma_uint64)(((ma_int64)((pcmFrameIndex-pcmRangeLo) * pFlac->channels * pFlac->bitsPerSample)/8.0f) * approxCompressionRatio);
                        if (targetByte > byteRangeHi) {
                            targetByte = byteRangeHi;
                        }
                        if (closestSeekOffsetBeforeTargetPCMFrame < lastSuccessfulSeekOffset) {
                            closestSeekOffsetBeforeTargetPCMFrame = lastSuccessfulSeekOffset;
                        }
                    }
                }
            }
        } else {
            break;
        }
    }
    ma_dr_flac__seek_to_first_frame(pFlac);
    return MA_FALSE;
}